

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,Function *func,bool decl)

{
  uint uVar1;
  uint uVar2;
  String *pSVar3;
  FunctionType *this_00;
  Type *type;
  IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
  IVar4;
  __normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var5;
  undefined7 in_register_00000011;
  Type *local_30;
  
  if ((int)CONCAT71(in_register_00000011,decl) != 0) {
    local_30 = Value::getType((Value *)func);
    pSVar3 = Function::getName_abi_cxx11_(func);
    append<char_const(&)[8],LLVMBC::Type*,char_const(&)[3],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
              (this,(char (*) [8])"define ",&local_30,(char (*) [3])" @",pSVar3,
               (char (*) [2])0x1c47eb);
    this_00 = Function::getFunctionType(func);
    uVar1 = FunctionType::getNumParams(this_00);
    if (uVar1 != 0) {
      uVar1 = 0;
      do {
        type = FunctionType::getParamType(this_00,uVar1);
        append(this,type);
        uVar1 = uVar1 + 1;
        uVar2 = FunctionType::getNumParams(this_00);
        if (uVar1 < uVar2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
        }
        uVar2 = FunctionType::getNumParams(this_00);
      } while (uVar1 < uVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,")",1);
    IVar4 = Function::begin(func);
    _Var5._M_current = (BasicBlock **)Function::end(func);
    if (IVar4.iter._M_current !=
        (__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
         )_Var5._M_current) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," {",2);
      this->indent = this->indent + 1;
      _Var5._M_current = (BasicBlock **)Function::begin(func);
      IVar4 = Function::end(func);
      for (; (__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
              )_Var5._M_current != IVar4.iter._M_current; _Var5._M_current = _Var5._M_current + 1) {
        append(this,*_Var5._M_current,true);
      }
      end_scope(this);
    }
    return;
  }
  pSVar3 = Function::getName_abi_cxx11_(func);
  append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&>
            (this,(char (*) [2])0x1c4917,pSVar3);
  return;
}

Assistant:

void StreamState::append(Function *func, bool decl)
{
	if (decl)
	{
		append("define ", func->getType(), " @", func->getName(), "(");
		auto *type = func->getFunctionType();
		for (unsigned i = 0; i < type->getNumParams(); i++)
		{
			append(type->getParamType(i));
			if (i + 1 < type->getNumParams())
				append(", ");
		}
		append(")");

		if (func->begin() != func->end())
		{
			begin_scope();
			for (auto &bb : *func)
				append(&bb, true);
			end_scope();
		}
	}
	else
		append("@", func->getName());
}